

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeCopyFile(Btree *pTo,Btree *pFrom)

{
  u16 *puVar1;
  int *piVar2;
  sqlite3_file *psVar3;
  Pager *pPager;
  int iVar4;
  int iVar5;
  sqlite3_backup b;
  sqlite3_backup local_68;
  
  if ((pTo->sharable != '\0') && (pTo->wantToLock = pTo->wantToLock + 1, pTo->locked == '\0')) {
    btreeLockCarefully(pTo);
  }
  if ((pFrom->sharable != '\0') &&
     (pFrom->wantToLock = pFrom->wantToLock + 1, pFrom->locked == '\0')) {
    btreeLockCarefully(pFrom);
  }
  psVar3 = pTo->pBt->pPager->fd;
  if (psVar3->pMethods != (sqlite3_io_methods *)0x0) {
    local_68.pDestDb = (sqlite3 *)((ulong)pFrom->pBt->nPage * (long)(int)pFrom->pBt->pageSize);
    if (psVar3->pMethods == (sqlite3_io_methods *)0x0) {
      iVar4 = 0xc;
    }
    else {
      iVar4 = (*psVar3->pMethods->xFileControl)(psVar3,0xb,&local_68);
    }
    iVar5 = 0;
    if (iVar4 != 0xc) {
      iVar5 = iVar4;
    }
    if (iVar5 != 0) goto LAB_00156348;
  }
  local_68.rc = 0;
  local_68.nRemaining = 0;
  local_68.nPagecount = 0;
  local_68.isAttached = 0;
  local_68.iDestSchema = 0;
  local_68.bDestLocked = 0;
  local_68.pDestDb = (sqlite3 *)0x0;
  local_68.pNext = (sqlite3_backup *)0x0;
  local_68.pSrcDb = pFrom->db;
  local_68.iNext = 1;
  local_68._28_4_ = 0;
  local_68.pDest = pTo;
  local_68.pSrc = pFrom;
  sqlite3_backup_step(&local_68,0x7fffffff);
  iVar5 = sqlite3_backup_finish(&local_68);
  if (iVar5 == 0) {
    puVar1 = &pTo->pBt->btsFlags;
    *puVar1 = *puVar1 & 0xfffd;
    iVar5 = 0;
  }
  else {
    pPager = (local_68.pDest)->pBt->pPager;
    if (pPager->tempFile == '\0') {
      pager_reset(pPager);
    }
  }
LAB_00156348:
  if (pFrom->sharable != '\0') {
    piVar2 = &pFrom->wantToLock;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      unlockBtreeMutex(pFrom);
    }
  }
  if (pTo->sharable != '\0') {
    piVar2 = &pTo->wantToLock;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      unlockBtreeMutex(pTo);
    }
  }
  return iVar5;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCopyFile(Btree *pTo, Btree *pFrom){
  int rc;
  sqlite3_file *pFd;              /* File descriptor for database pTo */
  sqlite3_backup b;
  sqlite3BtreeEnter(pTo);
  sqlite3BtreeEnter(pFrom);

  assert( sqlite3BtreeIsInTrans(pTo) );
  pFd = sqlite3PagerFile(sqlite3BtreePager(pTo));
  if( pFd->pMethods ){
    i64 nByte = sqlite3BtreeGetPageSize(pFrom)*(i64)sqlite3BtreeLastPage(pFrom);
    rc = sqlite3OsFileControl(pFd, SQLITE_FCNTL_OVERWRITE, &nByte);
    if( rc==SQLITE_NOTFOUND ) rc = SQLITE_OK;
    if( rc ) goto copy_finished;
  }

  /* Set up an sqlite3_backup object. sqlite3_backup.pDestDb must be set
  ** to 0. This is used by the implementations of sqlite3_backup_step()
  ** and sqlite3_backup_finish() to detect that they are being called
  ** from this function, not directly by the user.
  */
  memset(&b, 0, sizeof(b));
  b.pSrcDb = pFrom->db;
  b.pSrc = pFrom;
  b.pDest = pTo;
  b.iNext = 1;

#ifdef SQLITE_HAS_CODEC
  sqlite3PagerAlignReserve(sqlite3BtreePager(pTo), sqlite3BtreePager(pFrom));
#endif

  /* 0x7FFFFFFF is the hard limit for the number of pages in a database
  ** file. By passing this as the number of pages to copy to
  ** sqlite3_backup_step(), we can guarantee that the copy finishes 
  ** within a single call (unless an error occurs). The assert() statement
  ** checks this assumption - (p->rc) should be set to either SQLITE_DONE 
  ** or an error code.  */
  sqlite3_backup_step(&b, 0x7FFFFFFF);
  assert( b.rc!=SQLITE_OK );

  rc = sqlite3_backup_finish(&b);
  if( rc==SQLITE_OK ){
    pTo->pBt->btsFlags &= ~BTS_PAGESIZE_FIXED;
  }else{
    sqlite3PagerClearCache(sqlite3BtreePager(b.pDest));
  }

  assert( sqlite3BtreeIsInTrans(pTo)==0 );
copy_finished:
  sqlite3BtreeLeave(pFrom);
  sqlite3BtreeLeave(pTo);
  return rc;
}